

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCase::swap(TestCase *this,TestCase *other)

{
  TestCase *other_local;
  TestCase *this_local;
  
  Ptr<Catch::ITestCase>::swap(&this->test,&other->test);
  std::__cxx11::string::swap((string *)this);
  std::__cxx11::string::swap((string *)&(this->super_TestCaseInfo).className);
  std::__cxx11::string::swap((string *)&(this->super_TestCaseInfo).description);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::swap(&(this->super_TestCaseInfo).tags,&(other->super_TestCaseInfo).tags);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::swap(&(this->super_TestCaseInfo).lcaseTags,&(other->super_TestCaseInfo).lcaseTags);
  std::__cxx11::string::swap((string *)&(this->super_TestCaseInfo).tagsAsString);
  std::swap<Catch::TestCaseInfo::SpecialProperties>
            (&(this->super_TestCaseInfo).properties,&(other->super_TestCaseInfo).properties);
  std::swap<Catch::SourceLineInfo>
            (&(this->super_TestCaseInfo).lineInfo,&(other->super_TestCaseInfo).lineInfo);
  return;
}

Assistant:

void TestCase::swap( TestCase& other ) {
        test.swap( other.test );
        name.swap( other.name );
        className.swap( other.className );
        description.swap( other.description );
        tags.swap( other.tags );
        lcaseTags.swap( other.lcaseTags );
        tagsAsString.swap( other.tagsAsString );
        std::swap( TestCaseInfo::properties, static_cast<TestCaseInfo&>( other ).properties );
        std::swap( lineInfo, other.lineInfo );
    }